

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
RandomGen::VonNeumann
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,RandomGen *this,
          double xMin,double xMax,double yMin,double yMax,double xTest,double yTest,double fValue)

{
  RandomGen *pRVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  value_type *__val;
  double dVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  
  pdVar2 = (pointer)operator_new(0x18);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = pdVar2;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = pdVar2 + 3;
  pdVar2[2] = 0.0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = pdVar2 + 3;
  *pdVar2 = xTest;
  pdVar2[1] = yTest;
  dVar6 = 0.0;
  if (fValue < yTest) {
    if (m_pInstance == (RandomGen *)0x0) {
      m_pInstance = (RandomGen *)operator_new(0x18);
      (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ =
           0xc1f651c67c62c6e0;
      (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ =
           0x30d89576f866ac9f;
      m_pInstance->rng_locked = false;
      uVar7 = 0xc1f651c67c62c6e0;
      uVar8 = 0x30d89576f866ac9f;
    }
    else {
      uVar7 = (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_;
      uVar8 = (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_;
    }
    pRVar1 = m_pInstance;
    uVar3 = uVar8 ^ uVar7;
    uVar4 = uVar3 << 0x25 | uVar3 >> 0x1b;
    uVar5 = (uVar7 << 0x18 | uVar7 >> 0x28) ^ uVar3 ^ uVar3 << 0x10;
    uVar3 = uVar4 ^ uVar5;
    (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ =
         uVar3 << 0x10 ^ (uVar5 << 0x18 | uVar5 >> 0x28) ^ uVar3;
    (pRVar1->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ =
         uVar3 << 0x25 | uVar3 >> 0x1b;
    uVar5 = uVar5 + uVar4;
    *pdVar2 = xMin + (((double)(uVar7 + uVar8 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25
                      ) + (double)(uVar7 + uVar8 & 0xffffffff | 0x4330000000000000)) *
                     5.421010862427522e-20 * (xMax - xMin);
    pdVar2[1] = yMin + (((double)(uVar5 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                       (double)(uVar5 & 0xffffffff | 0x4330000000000000)) * 5.421010862427522e-20 *
                       (yMax - yMin);
    dVar6 = 1.0;
  }
  pdVar2[2] = dVar6;
  return __return_storage_ptr__;
}

Assistant:

vector<double> RandomGen::VonNeumann(double xMin, double xMax, double yMin,
                                     double yMax, double xTest, double yTest,
                                     double fValue) {
  vector<double> xyTry(3);

  xyTry[0] = xTest;
  xyTry[1] = yTest;

  if (xyTry[1] > fValue) {
    xyTry[0] = xMin + (xMax - xMin) * RandomGen::rndm()->rand_uniform();
    xyTry[1] = yMin + (yMax - yMin) * RandomGen::rndm()->rand_uniform();
    xyTry[2] = 1.;
  } else
    xyTry[2] = 0.;

  return xyTry;  // doing a vector means you can return 2 values at the same
                 // time
}